

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

_Bool bson_iter_recurse(bson_iter_t *iter,bson_iter_t *child)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  
  if (iter == (bson_iter_t *)0x0) {
    pcVar5 = "iter";
    uVar4 = 0x99;
  }
  else {
    if (child != (bson_iter_t *)0x0) {
      puVar3 = iter->raw;
      uVar1 = puVar3[iter->type];
      if ((byte)(uVar1 - 3) < 2) {
        uVar2 = *(uint32_t *)(puVar3 + iter->d1);
        child->raw = puVar3 + iter->d1;
        child->len = uVar2;
        child->off = 0;
        child->type = 0;
        child->key = 0;
        child->d1 = 0;
        child->d1 = 0;
        child->d2 = 0;
        child->d3 = 0;
        child->d4 = 0;
        child->next_off = 4;
        child->err_off = 0;
      }
      return (byte)(uVar1 - 3) < 2;
    }
    pcVar5 = "child";
    uVar4 = 0x9a;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,uVar4,"bson_iter_recurse",pcVar5);
  abort();
}

Assistant:

bool
bson_iter_recurse (const bson_iter_t *iter, /* IN */
                   bson_iter_t *child)      /* OUT */
{
   const uint8_t *data = NULL;
   uint32_t len = 0;

   BSON_ASSERT (iter);
   BSON_ASSERT (child);

   if (ITER_TYPE (iter) == BSON_TYPE_DOCUMENT) {
      bson_iter_document (iter, &len, &data);
   } else if (ITER_TYPE (iter) == BSON_TYPE_ARRAY) {
      bson_iter_array (iter, &len, &data);
   } else {
      return false;
   }

   child->raw = data;
   child->len = len;
   child->off = 0;
   child->type = 0;
   child->key = 0;
   child->d1 = 0;
   child->d2 = 0;
   child->d3 = 0;
   child->d4 = 0;
   child->next_off = 4;
   child->err_off = 0;

   return true;
}